

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  pointer puVar4;
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar5;
  
  marray_detail::Assert<bool>(this->index_ != 0 && this->view_ != (view_pointer)0x0);
  this->index_ = this->index_ - 1;
  bVar1 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
  if (bVar1) {
    this->pointer_ = this->pointer_ + -1;
  }
  else {
    pVVar5 = this->view_;
    if (this->index_ == (pVVar5->geometry_).size_) {
      this->pointer_ = this->pointer_ + -1;
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar5);
      if ((pVVar5->geometry_).coordinateOrder_ == LastMajorOrder) {
        puVar4 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *puVar4 = *puVar4 - 1;
      }
      else {
        sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        puVar4 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + (sVar3 - 1);
        *puVar4 = *puVar4 - 1;
      }
    }
    else {
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar5);
      if ((pVVar5->geometry_).coordinateOrder_ == LastMajorOrder) {
        puVar4 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (sVar3 = 0;
            sVar3 < (ulong)((long)(this->coordinates_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3);
            sVar3 = sVar3 + 1) {
          pVVar5 = this->view_;
          if (puVar4[sVar3] != 0) goto LAB_001c53f0;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(pVVar5,sVar3);
          (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar3] = sVar2 - 1;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar3);
          puVar4 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          this->pointer_ = this->pointer_ + sVar2 * puVar4[sVar3];
        }
      }
      else {
        sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        puVar4 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          sVar3 = sVar3 - 1;
          pVVar5 = this->view_;
          if (puVar4[sVar3] != 0) goto LAB_001c53f0;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(pVVar5,sVar3);
          (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar3] = sVar2 - 1;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,sVar3);
          puVar4 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          this->pointer_ = this->pointer_ + sVar2 * puVar4[sVar3];
        } while (sVar3 != 0);
      }
    }
  }
LAB_001c52df:
  testInvariant(this);
  return this;
LAB_001c53f0:
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(pVVar5,sVar3);
  this->pointer_ = this->pointer_ + -sVar2;
  puVar4 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + sVar3;
  *puVar4 = *puVar4 - 1;
  goto LAB_001c52df;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator--()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || (view_ != 0 && index_ > 0));
    --index_;
    if(view_->isSimple()) {
        --pointer_;
    }
    else {
        if(index_ == view_->size()) { 
            // decrement from end iterator
            --pointer_;
            if(view_->coordinateOrder() == LastMajorOrder) {
                --coordinates_[0];
            }
            else { // FirstMajorOrder
                --coordinates_[view_->dimension() - 1];
            }
        }
        else {
            if(view_->coordinateOrder() == LastMajorOrder) {
                for(std::size_t j=0; j<coordinates_.size(); ++j) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                }
            }
            else { // FirstMajorOrder
                std::size_t j = view_->dimension() - 1;
                for(;;) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
    testInvariant();
    return *this;
}